

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O2

fio_msg_metadata_s *
websocket_optimize_generic
          (fio_msg_metadata_s *__return_storage_ptr__,fio_str_info_s ch,fio_str_info_s msg,
          uint8_t is_json)

{
  size_t sVar1;
  uchar opcode;
  fio_str_s local_40;
  
  local_40.ref = 0;
  local_40.capa._4_4_ = 0;
  local_40.small = '\0';
  local_40.frozen = '\0';
  local_40.reserved[0] = '\0';
  local_40.reserved[1] = '\0';
  local_40.reserved[2] = '\0';
  local_40.reserved[3] = '\0';
  local_40.reserved[4] = '\0';
  local_40.reserved[5] = '\0';
  local_40._12_8_ = 0;
  local_40.len = ch.len;
  local_40.data = ch.data;
  local_40.dealloc = (_func_void_void_ptr *)0x0;
  opcode = '\x02';
  if (ch.len < 0x100001) {
    sVar1 = fio_str_utf8_valid(&local_40);
    opcode = (sVar1 == 0) + '\x01';
  }
  websocket_optimize(__return_storage_ptr__,msg,opcode);
  __return_storage_ptr__->type_id = -0x20;
  return __return_storage_ptr__;
}

Assistant:

static fio_msg_metadata_s websocket_optimize_generic(fio_str_info_s ch,
                                                     fio_str_info_s msg,
                                                     uint8_t is_json) {
  fio_str_s tmp = FIO_STR_INIT_EXISTING(ch.data, ch.len, 0); // don't free
  tmp.dealloc = NULL;
  unsigned char opcode = 2;
  if (tmp.len <= (2 << 19) && fio_str_utf8_valid(&tmp)) {
    opcode = 1;
  }
  fio_msg_metadata_s ret = websocket_optimize(msg, opcode);
  ret.type_id = WEBSOCKET_OPTIMIZE_PUBSUB;
  return ret;
  (void)ch;
  (void)is_json;
}